

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceAABB.cpp
# Opt level: O1

AABB * __thiscall IceMaths::AABB::Add(AABB *this,AABB *aabb)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar1 = (this->mExtents).x;
  fVar6 = (this->mCenter).x;
  fVar7 = (this->mCenter).y;
  fVar9 = fVar6 - fVar1;
  fVar2 = (this->mExtents).y;
  fVar10 = fVar7 - fVar2;
  fVar8 = (this->mCenter).z;
  fVar3 = (this->mExtents).z;
  fVar11 = fVar8 - fVar3;
  fVar4 = (aabb->mExtents).x;
  fVar12 = (aabb->mCenter).x;
  fVar13 = (aabb->mCenter).y;
  fVar14 = fVar12 - fVar4;
  if (fVar14 <= fVar9) {
    fVar9 = fVar14;
  }
  fVar14 = (aabb->mExtents).y;
  fVar15 = fVar13 - fVar14;
  if (fVar15 <= fVar10) {
    fVar10 = fVar15;
  }
  fVar15 = (aabb->mCenter).z;
  fVar5 = (aabb->mExtents).z;
  fVar16 = fVar15 - fVar5;
  if (fVar16 <= fVar11) {
    fVar11 = fVar16;
  }
  fVar6 = fVar6 + fVar1;
  fVar7 = fVar7 + fVar2;
  fVar8 = fVar8 + fVar3;
  fVar12 = fVar12 + fVar4;
  if (fVar6 <= fVar12) {
    fVar6 = fVar12;
  }
  fVar13 = fVar13 + fVar14;
  if (fVar7 <= fVar13) {
    fVar7 = fVar13;
  }
  fVar15 = fVar15 + fVar5;
  if (fVar8 <= fVar15) {
    fVar8 = fVar15;
  }
  (this->mCenter).x = (fVar6 + fVar9) * 0.5;
  (this->mCenter).y = (fVar7 + fVar10) * 0.5;
  (this->mCenter).z = (fVar8 + fVar11) * 0.5;
  (this->mExtents).x = (fVar6 - fVar9) * 0.5;
  (this->mExtents).y = (fVar7 - fVar10) * 0.5;
  (this->mExtents).z = (fVar8 - fVar11) * 0.5;
  return this;
}

Assistant:

AABB& AABB::Add(const AABB& aabb)
{
	// Compute new min & max values
	Point Min;	GetMin(Min);
	Point Tmp;	aabb.GetMin(Tmp);
	Min.Min(Tmp);

	Point Max;	GetMax(Max);
	aabb.GetMax(Tmp);
	Max.Max(Tmp);

	// Update this
	SetMinMax(Min, Max);
	return *this;
}